

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Runner::sectionEnded(Runner *this,string *name,Counts *prevAssertions)

{
  bool bVar1;
  size_t sVar2;
  ConfigData *pCVar3;
  IReporter *pIVar4;
  undefined1 local_30 [8];
  Counts assertions;
  Counts *prevAssertions_local;
  string *name_local;
  Runner *this_local;
  
  assertions.failed = (size_t)prevAssertions;
  _local_30 = Counts::operator-(&(this->m_totals).assertions,prevAssertions);
  sVar2 = Counts::total((Counts *)local_30);
  if (sVar2 == 0) {
    pCVar3 = Config::data(this->m_config);
    if ((pCVar3->warnings & NoAssertions) != Nothing) {
      bVar1 = RunningTest::isBranchSection(this->m_runningTest);
      if (!bVar1) {
        pIVar4 = Ptr<Catch::IReporter>::operator->(&this->m_reporter);
        (*(pIVar4->super_IShared).super_NonCopyable._vptr_NonCopyable[0xd])(pIVar4,name);
        (this->m_totals).assertions.failed = (this->m_totals).assertions.failed + 1;
        assertions.passed = assertions.passed + 1;
      }
    }
  }
  RunningTest::endSection(this->m_runningTest,name);
  pIVar4 = Ptr<Catch::IReporter>::operator->(&this->m_reporter);
  (*(pIVar4->super_IShared).super_NonCopyable._vptr_NonCopyable[0xc])(pIVar4,name,local_30);
  return;
}

Assistant:

virtual void sectionEnded( const std::string& name, const Counts& prevAssertions ) {
            Counts assertions = m_totals.assertions - prevAssertions;
            if( assertions.total() == 0  &&
               ( m_config.data().warnings & ConfigData::WarnAbout::NoAssertions ) &&
               !m_runningTest->isBranchSection() ) {
                m_reporter->NoAssertionsInSection( name );
                m_totals.assertions.failed++;
                assertions.failed++;
            }
            m_runningTest->endSection( name );
            m_reporter->EndSection( name, assertions );
        }